

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_extension.c
# Opt level: O1

int dlep_extension_get_l2_neighbor_key(oonf_layer2_neigh_key *key,dlep_session *session)

{
  int iVar1;
  int line;
  oonf_log_source source;
  oonf_log_severity severity;
  char *format;
  
  *(undefined8 *)&(key->addr)._type = 0;
  key->link_id[5] = '\0';
  key->link_id[6] = '\0';
  key->link_id[7] = '\0';
  key->link_id[8] = '\0';
  key->link_id[9] = '\0';
  key->link_id[10] = '\0';
  key->link_id[0xb] = '\0';
  key->link_id[0xc] = '\0';
  (key->addr)._addr[0] = '\0';
  (key->addr)._addr[1] = '\0';
  (key->addr)._addr[2] = '\0';
  (key->addr)._addr[3] = '\0';
  (key->addr)._addr[4] = '\0';
  (key->addr)._addr[5] = '\0';
  (key->addr)._addr[6] = '\0';
  (key->addr)._addr[7] = '\0';
  (key->addr)._addr[8] = '\0';
  (key->addr)._addr[9] = '\0';
  (key->addr)._addr[10] = '\0';
  (key->addr)._addr[0xb] = '\0';
  (key->addr)._addr[0xc] = '\0';
  (key->addr)._addr[0xd] = '\0';
  (key->addr)._addr[0xe] = '\0';
  (key->addr)._addr[0xf] = '\0';
  key->link_id[0xc] = '\0';
  key->link_id[0xd] = '\0';
  key->link_id[0xe] = '\0';
  key->link_id[0xf] = '\0';
  iVar1 = dlep_reader_mac_tlv(key,session,(dlep_parser_value *)0x0);
  if (iVar1 == 0) {
    iVar1 = dlep_reader_lid_tlv(key,session,(dlep_parser_value *)0x0);
    if (iVar1 == 0) {
      if ((session->cfg).lid_length == (uint)key->link_id_length) {
        return 0;
      }
      source = session->log_source;
      iVar1 = -1;
      if ((log_global_mask[source] & 2) == 0) {
        return -1;
      }
      format = "LID TLV (length=%u) with bad length (should be %u)";
      severity = LOG_SEVERITY_INFO;
      line = 0xd4;
    }
    else {
      source = session->log_source;
      if ((log_global_mask[source] & 1) == 0) {
        return 0;
      }
      format = "lid tlv not present";
      iVar1 = 0;
      severity = LOG_SEVERITY_DEBUG;
      line = 0xd0;
    }
  }
  else {
    source = session->log_source;
    iVar1 = -1;
    if ((log_global_mask[source] & 2) == 0) {
      return -1;
    }
    format = "mac tlv missing";
    severity = LOG_SEVERITY_INFO;
    line = 0xcb;
  }
  oonf_log(severity,source,"src/generic/dlep/dlep_extension.c",line,(void *)0x0,0,format);
  return iVar1;
}

Assistant:

int
dlep_extension_get_l2_neighbor_key(struct oonf_layer2_neigh_key *key, struct dlep_session *session) {
  memset(key, 0, sizeof(*key));
  if (dlep_reader_mac_tlv(key, session, NULL)) {
    OONF_INFO(session->log_source, "mac tlv missing");
    return -1;
  }

  if (dlep_reader_lid_tlv(key, session, NULL)) {
    OONF_DEBUG(session->log_source, "lid tlv not present");
  }
  else if (key->link_id_length != session->cfg.lid_length) {
    OONF_INFO(session->log_source, "LID TLV (length=%u) with bad length (should be %u)",
              key->link_id_length, session->cfg.lid_length);
    return -1;
  }
  return 0;
}